

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCount(BtCursor *pCur,i64 *pnEntry)

{
  uint uVar1;
  u32 uVar2;
  MemPage *local_38;
  MemPage *pPage;
  int iIdx;
  int rc;
  i64 nEntry;
  i64 *pnEntry_local;
  BtCursor *pCur_local;
  
  _iIdx = 0;
  if (pCur->pgnoRoot == 0) {
    *pnEntry = 0;
    pCur_local._4_4_ = 0;
  }
  else {
    pPage._4_4_ = moveToRoot(pCur);
    while (pPage._4_4_ == 0) {
      local_38 = pCur->apPage[pCur->iPage];
      if ((local_38->leaf != '\0') || (local_38->intKey == '\0')) {
        _iIdx = (ulong)local_38->nCell + _iIdx;
      }
      if (local_38->leaf != '\0') {
        do {
          if (pCur->iPage == 0) {
            *pnEntry = _iIdx;
            return 0;
          }
          moveToParent(pCur);
        } while (pCur->apPage[pCur->iPage]->nCell <= pCur->aiIdx[pCur->iPage]);
        pCur->aiIdx[pCur->iPage] = pCur->aiIdx[pCur->iPage] + 1;
        local_38 = pCur->apPage[pCur->iPage];
      }
      uVar1 = (uint)pCur->aiIdx[pCur->iPage];
      if (uVar1 == local_38->nCell) {
        uVar2 = sqlite3Get4byte(local_38->aData + (int)(local_38->hdrOffset + 8));
        pPage._4_4_ = moveToChild(pCur,uVar2);
      }
      else {
        uVar2 = sqlite3Get4byte(local_38->aData +
                                (int)(uint)(local_38->maskPage &
                                           CONCAT11(local_38->aCellIdx[(int)(uVar1 << 1)],
                                                    local_38->aCellIdx[(long)(int)(uVar1 << 1) + 1])
                                           ));
        pPage._4_4_ = moveToChild(pCur,uVar2);
      }
    }
    pCur_local._4_4_ = pPage._4_4_;
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCount(BtCursor *pCur, i64 *pnEntry){
  i64 nEntry = 0;                      /* Value to return in *pnEntry */
  int rc;                              /* Return code */

  if( pCur->pgnoRoot==0 ){
    *pnEntry = 0;
    return SQLITE_OK;
  }
  rc = moveToRoot(pCur);

  /* Unless an error occurs, the following loop runs one iteration for each
  ** page in the B-Tree structure (not including overflow pages). 
  */
  while( rc==SQLITE_OK ){
    int iIdx;                          /* Index of child node in parent */
    MemPage *pPage;                    /* Current page of the b-tree */

    /* If this is a leaf page or the tree is not an int-key tree, then 
    ** this page contains countable entries. Increment the entry counter
    ** accordingly.
    */
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->leaf || !pPage->intKey ){
      nEntry += pPage->nCell;
    }

    /* pPage is a leaf node. This loop navigates the cursor so that it 
    ** points to the first interior cell that it points to the parent of
    ** the next page in the tree that has not yet been visited. The
    ** pCur->aiIdx[pCur->iPage] value is set to the index of the parent cell
    ** of the page, or to the number of cells in the page if the next page
    ** to visit is the right-child of its parent.
    **
    ** If all pages in the tree have been visited, return SQLITE_OK to the
    ** caller.
    */
    if( pPage->leaf ){
      do {
        if( pCur->iPage==0 ){
          /* All pages of the b-tree have been visited. Return successfully. */
          *pnEntry = nEntry;
          return SQLITE_OK;
        }
        moveToParent(pCur);
      }while ( pCur->aiIdx[pCur->iPage]>=pCur->apPage[pCur->iPage]->nCell );

      pCur->aiIdx[pCur->iPage]++;
      pPage = pCur->apPage[pCur->iPage];
    }

    /* Descend to the child node of the cell that the cursor currently 
    ** points at. This is the right-child if (iIdx==pPage->nCell).
    */
    iIdx = pCur->aiIdx[pCur->iPage];
    if( iIdx==pPage->nCell ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
    }else{
      rc = moveToChild(pCur, get4byte(findCell(pPage, iIdx)));
    }
  }

  /* An error has occurred. Return an error code. */
  return rc;
}